

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassCache.cpp
# Opt level: O0

void __thiscall
Diligent::RenderPassCache::RenderPassCache(RenderPassCache *this,RenderDeviceVkImpl *DeviceVk)

{
  RenderDeviceVkImpl *DeviceVk_local;
  RenderPassCache *this_local;
  
  this->m_DeviceVkImpl = DeviceVk;
  std::mutex::mutex(&this->m_Mutex);
  std::
  unordered_map<Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>,_Diligent::RenderPassCache::RenderPassCacheKeyHash,_std::equal_to<Diligent::RenderPassCache::RenderPassCacheKey>,_std::allocator<std::pair<const_Diligent::RenderPassCache::RenderPassCacheKey,_Diligent::RefCntAutoPtr<Diligent::RenderPassVkImpl>_>_>_>
  ::unordered_map(&this->m_Cache);
  return;
}

Assistant:

RenderPassCache::RenderPassCache(RenderDeviceVkImpl& DeviceVk) noexcept :
    m_DeviceVkImpl{DeviceVk}
{}